

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void Assimp::Write(JSONWriter *out,aiScene *ai)

{
  aiScene *paVar1;
  bool bVar2;
  uint local_190;
  allocator<char> local_189;
  uint n_5;
  uint local_168;
  allocator<char> local_161;
  uint n_4;
  uint local_140;
  allocator<char> local_139;
  uint n_3;
  uint local_118;
  allocator<char> local_111;
  uint n_2;
  uint local_f0;
  allocator<char> local_e9;
  uint n_1;
  uint local_c8;
  allocator<char> local_c1;
  uint n;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  aiScene *local_18;
  aiScene *ai_local;
  JSONWriter *out_local;
  
  local_18 = ai;
  ai_local = (aiScene *)out;
  JSONWriter::StartObj(out,false);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"__metadata__",&local_39);
  JSONWriter::Key((JSONWriter *)paVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  WriteFormatInfo((JSONWriter *)ai_local);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"rootnode",&local_71);
  JSONWriter::Key((JSONWriter *)paVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  Write((JSONWriter *)ai_local,local_18->mRootNode,false);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"flags",&local_99);
  JSONWriter::Key((JSONWriter *)paVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  JSONWriter::SimpleValue<unsigned_int>((JSONWriter *)ai_local,&local_18->mFlags);
  bVar2 = aiScene::HasMeshes(local_18);
  paVar1 = ai_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&n,"meshes",&local_c1);
    JSONWriter::Key((JSONWriter *)paVar1,(string *)&n);
    std::__cxx11::string::~string((string *)&n);
    std::allocator<char>::~allocator(&local_c1);
    JSONWriter::StartArray((JSONWriter *)ai_local,false);
    for (local_c8 = 0; local_c8 < local_18->mNumMeshes; local_c8 = local_c8 + 1) {
      Write((JSONWriter *)ai_local,local_18->mMeshes[local_c8],true);
    }
    JSONWriter::EndArray((JSONWriter *)ai_local);
  }
  bVar2 = aiScene::HasMaterials(local_18);
  paVar1 = ai_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&n_1,"materials",&local_e9);
    JSONWriter::Key((JSONWriter *)paVar1,(string *)&n_1);
    std::__cxx11::string::~string((string *)&n_1);
    std::allocator<char>::~allocator(&local_e9);
    JSONWriter::StartArray((JSONWriter *)ai_local,false);
    for (local_f0 = 0; local_f0 < local_18->mNumMaterials; local_f0 = local_f0 + 1) {
      Write((JSONWriter *)ai_local,local_18->mMaterials[local_f0],true);
    }
    JSONWriter::EndArray((JSONWriter *)ai_local);
  }
  bVar2 = aiScene::HasAnimations(local_18);
  paVar1 = ai_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&n_2,"animations",&local_111);
    JSONWriter::Key((JSONWriter *)paVar1,(string *)&n_2);
    std::__cxx11::string::~string((string *)&n_2);
    std::allocator<char>::~allocator(&local_111);
    JSONWriter::StartArray((JSONWriter *)ai_local,false);
    for (local_118 = 0; local_118 < local_18->mNumAnimations; local_118 = local_118 + 1) {
      Write((JSONWriter *)ai_local,local_18->mAnimations[local_118],true);
    }
    JSONWriter::EndArray((JSONWriter *)ai_local);
  }
  bVar2 = aiScene::HasLights(local_18);
  paVar1 = ai_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&n_3,"lights",&local_139);
    JSONWriter::Key((JSONWriter *)paVar1,(string *)&n_3);
    std::__cxx11::string::~string((string *)&n_3);
    std::allocator<char>::~allocator(&local_139);
    JSONWriter::StartArray((JSONWriter *)ai_local,false);
    for (local_140 = 0; local_140 < local_18->mNumLights; local_140 = local_140 + 1) {
      Write((JSONWriter *)ai_local,local_18->mLights[local_140],true);
    }
    JSONWriter::EndArray((JSONWriter *)ai_local);
  }
  bVar2 = aiScene::HasCameras(local_18);
  paVar1 = ai_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&n_4,"cameras",&local_161);
    JSONWriter::Key((JSONWriter *)paVar1,(string *)&n_4);
    std::__cxx11::string::~string((string *)&n_4);
    std::allocator<char>::~allocator(&local_161);
    JSONWriter::StartArray((JSONWriter *)ai_local,false);
    for (local_168 = 0; local_168 < local_18->mNumCameras; local_168 = local_168 + 1) {
      Write((JSONWriter *)ai_local,local_18->mCameras[local_168],true);
    }
    JSONWriter::EndArray((JSONWriter *)ai_local);
  }
  bVar2 = aiScene::HasTextures(local_18);
  paVar1 = ai_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&n_5,"textures",&local_189);
    JSONWriter::Key((JSONWriter *)paVar1,(string *)&n_5);
    std::__cxx11::string::~string((string *)&n_5);
    std::allocator<char>::~allocator(&local_189);
    JSONWriter::StartArray((JSONWriter *)ai_local,false);
    for (local_190 = 0; local_190 < local_18->mNumTextures; local_190 = local_190 + 1) {
      Write((JSONWriter *)ai_local,local_18->mTextures[local_190],true);
    }
    JSONWriter::EndArray((JSONWriter *)ai_local);
  }
  JSONWriter::EndObj((JSONWriter *)ai_local);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiScene& ai) {
    out.StartObj();

    out.Key("__metadata__");
    WriteFormatInfo(out);

    out.Key("rootnode");
    Write(out, *ai.mRootNode, false);

    out.Key("flags");
    out.SimpleValue(ai.mFlags);

    if (ai.HasMeshes()) {
        out.Key("meshes");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumMeshes; ++n) {
            Write(out, *ai.mMeshes[n]);
        }
        out.EndArray();
    }

    if (ai.HasMaterials()) {
        out.Key("materials");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumMaterials; ++n) {
            Write(out, *ai.mMaterials[n]);
        }
        out.EndArray();
    }

    if (ai.HasAnimations()) {
        out.Key("animations");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumAnimations; ++n) {
            Write(out, *ai.mAnimations[n]);
        }
        out.EndArray();
    }

    if (ai.HasLights()) {
        out.Key("lights");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumLights; ++n) {
            Write(out, *ai.mLights[n]);
        }
        out.EndArray();
    }

    if (ai.HasCameras()) {
        out.Key("cameras");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumCameras; ++n) {
            Write(out, *ai.mCameras[n]);
        }
        out.EndArray();
    }

    if (ai.HasTextures()) {
        out.Key("textures");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumTextures; ++n) {
            Write(out, *ai.mTextures[n]);
        }
        out.EndArray();
    }
    out.EndObj();
}